

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void LD_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar13 [32];
  
  if (0 < nbytes) {
    auVar12 = vpbroadcastq_avx512vl();
    auVar10 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar14 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    lVar7 = 0;
    auVar13 = vpermq_avx2(auVar12,0x1b);
    auVar23._8_8_ = 4;
    auVar23._0_8_ = 4;
    auVar23._16_8_ = 4;
    auVar23._24_8_ = 4;
    auVar11._8_4_ = 4;
    auVar11._0_8_ = 0x400000004;
    auVar11._12_4_ = 4;
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar4 = auVar14;
      auVar24 = auVar6;
      auVar14 = vpermq_avx2(auVar4,0x1b);
      uVar8 = vpcmpuq_avx512vl(auVar14,auVar13,2);
      uVar8 = uVar8 & 0xf;
      auVar9 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(key + lVar7 + ((ulong)(uint)nbytes - 4)));
      auVar9 = vpshufb_avx(ZEXT416(CONCAT13((char)(uVar8 >> 3) * auVar9[3],
                                            CONCAT12(((byte)(uVar8 >> 2) & 1) * auVar9[2],
                                                     CONCAT11(((byte)(uVar8 >> 1) & 1) * auVar9[1],
                                                              ((byte)uVar8 & 1) * auVar9[0])))),
                           _DAT_0010c020);
      auVar25 = vpslld_avx(auVar10,3);
      auVar9 = vpsllvd_avx2(auVar9,auVar25);
      auVar14 = vpmovzxdq_avx2(auVar9);
      auVar5 = vpor_avx2(auVar24._0_32_,auVar14);
      auVar14 = vpaddq_avx2(auVar4,auVar23);
      auVar10 = vpaddd_avx(auVar10,auVar11);
      lVar7 = lVar7 + -4;
      auVar6 = ZEXT3264(auVar5);
    } while (-lVar7 != (ulong)(nbytes + 3U & 0xfffffffc));
    uVar8 = vpcmpuq_avx512vl(auVar4,auVar12,2);
    uVar8 = uVar8 & 0xf;
    auVar13 = vmovdqa64_avx512vl(auVar5);
    bVar1 = (bool)((byte)uVar8 & 1);
    auVar10._0_8_ = (ulong)bVar1 * auVar13._0_8_ | (ulong)!bVar1 * auVar24._0_8_;
    bVar1 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar10._8_8_ = (ulong)bVar1 * auVar13._8_8_ | (ulong)!bVar1 * auVar24._8_8_;
    bVar1 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar14._16_8_ = (ulong)bVar1 * auVar13._16_8_ | (ulong)!bVar1 * auVar24._16_8_;
    auVar14._0_16_ = auVar10;
    auVar14._24_8_ = (uVar8 >> 3) * auVar13._24_8_ | (ulong)!SUB81(uVar8 >> 3,0) * auVar24._24_8_;
    auVar10 = vpor_avx(auVar10,auVar14._16_16_);
    auVar11 = vpshufd_avx(auVar10,0xee);
    vpor_avx(auVar10,auVar11);
  }
  if (0 < nbytes) {
    auVar15 = vpbroadcastq_avx512vl();
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x1f1e1d1c));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x1b1a1918));
    auVar4 = vpmovsxbq_avx2(ZEXT416(0x17161514));
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x13121110));
    auVar23 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
    auVar12 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
    auVar13 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar16 = vpbroadcastq_avx512vl();
    auVar14 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    uVar8 = 0;
    auVar26._8_8_ = 0x20;
    auVar26._0_8_ = 0x20;
    auVar26._16_8_ = 0x20;
    auVar26._24_8_ = 0x20;
    do {
      vpcmpuq_avx512vl(auVar14,auVar15,2);
      vpcmpuq_avx512vl(auVar13,auVar15,2);
      vpcmpuq_avx512vl(auVar12,auVar15,2);
      vpcmpuq_avx512vl(auVar23,auVar15,2);
      vpcmpuq_avx512vl(auVar5,auVar15,2);
      vpcmpuq_avx512vl(auVar4,auVar15,2);
      vpcmpuq_avx512vl(auVar3,auVar15,2);
      vpcmpuq_avx512vl(auVar2,auVar15,2);
      auVar27 = vpsllq_avx2(auVar14,3);
      auVar28 = vpsllq_avx2(auVar5,3);
      auVar29 = vpsllq_avx2(auVar13,3);
      auVar30 = vpsllq_avx2(auVar4,3);
      auVar31 = vpsllq_avx2(auVar12,3);
      auVar17 = vpsllq_avx512vl(auVar3,3);
      auVar18 = vpsllq_avx512vl(auVar23,3);
      auVar19 = vpsllq_avx512vl(auVar2,3);
      auVar20 = vpsrlvq_avx512vl(auVar16,auVar19);
      auVar21 = vpsrlvq_avx512vl(auVar16,auVar18);
      auVar22 = vpsrlvq_avx512vl(auVar16,auVar17);
      auVar18 = vpsrlvq_avx2(auVar16,auVar31);
      auVar17 = vpsrlvq_avx2(auVar16,auVar30);
      auVar19 = vpsrlvq_avx2(auVar16,auVar29);
      auVar28 = vpsrlvq_avx2(auVar16,auVar28);
      auVar27 = vpsrlvq_avx2(auVar16,auVar27);
      auVar10 = vpmovqb_avx512vl(auVar27);
      auVar11 = vpmovqb_avx512vl(auVar28);
      auVar28._0_16_ = ZEXT116(0) * ZEXT416(auVar11._0_4_) + ZEXT116(1) * ZEXT416(auVar10._0_4_);
      auVar28._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * ZEXT416(auVar11._0_4_);
      auVar10 = vpmovqb_avx512vl(auVar19);
      auVar11 = vpmovqb_avx512vl(auVar17);
      auVar17._0_16_ = ZEXT116(0) * ZEXT416(auVar11._0_4_) + ZEXT116(1) * ZEXT416(auVar10._0_4_);
      auVar17._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * ZEXT416(auVar11._0_4_);
      auVar17 = vpunpckldq_avx2(auVar28,auVar17);
      auVar10 = vpmovqb_avx512vl(auVar18);
      auVar11 = vpmovqb_avx512vl(auVar22);
      auVar9 = vpmovqb_avx512vl(auVar21);
      auVar18._0_16_ = ZEXT116(0) * ZEXT416(auVar11._0_4_) + ZEXT116(1) * ZEXT416(auVar10._0_4_);
      auVar18._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * ZEXT416(auVar11._0_4_);
      auVar10 = vpmovqb_avx512vl(auVar20);
      auVar19._0_16_ = ZEXT116(0) * ZEXT416(auVar10._0_4_) + ZEXT116(1) * ZEXT416(auVar9._0_4_);
      auVar19._16_16_ = ZEXT116(1) * ZEXT416(auVar10._0_4_);
      auVar18 = vpunpckldq_avx2(auVar18,auVar19);
      auVar17 = vpunpcklqdq_avx2(auVar17,auVar18);
      auVar17 = vmovdqu8_avx512vl(auVar17);
      *(undefined1 (*) [32])(ret_key + uVar8) = auVar17;
      uVar8 = uVar8 + 0x20;
      auVar14 = vpaddq_avx2(auVar14,auVar26);
      auVar13 = vpaddq_avx2(auVar26,auVar13);
      auVar12 = vpaddq_avx2(auVar26,auVar12);
      auVar23 = vpaddq_avx2(auVar26,auVar23);
      auVar5 = vpaddq_avx2(auVar26,auVar5);
      auVar4 = vpaddq_avx2(auVar26,auVar4);
      auVar3 = vpaddq_avx2(auVar26,auVar3);
      auVar2 = vpaddq_avx2(auVar26,auVar2);
    } while ((nbytes + 0x1fU & 0xffffffe0) != uVar8);
  }
  return;
}

Assistant:

void LD_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	unsigned long long new_key = 0;
	int i;
	for (i = 0; i < nbytes; ++i) {
		new_key |= key[nbytes - i - 1] << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffff);
	for (i = 0; i < nbytes; ++i) {
		ret_key[i] = (new_key >> (i * 8)) & 0xff;
	}
}